

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
          (void *this,Symbol *a,Symbol *b)

{
  bool bVar1;
  int iVar2;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_48;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_30;
  
  Symbol::parent_name_key(&local_30,(Symbol *)this);
  Symbol::parent_name_key(&local_48,a);
  if ((local_30.first == local_48.first) && (local_30.second._M_len == local_48.second._M_len)) {
    if (local_30.second._M_len != 0) {
      iVar2 = bcmp(local_30.second._M_str,local_48.second._M_str,local_30.second._M_len);
      if (iVar2 != 0) goto LAB_001781e8;
    }
    bVar1 = true;
  }
  else {
LAB_001781e8:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.parent_name_key() == b.parent_name_key();
  }